

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::DoSpecialDamage(AActor *this,AActor *target,int damage,FName damagetype)

{
  player_t *ppVar1;
  
  ppVar1 = target->player;
  if ((((ppVar1 != (player_t *)0x0) && (damage < 1000)) && (ppVar1->mo == (APlayerPawn *)target)) &&
     ((ppVar1->cheats & 0x2000002U) != 0)) {
    damage = -1;
  }
  return damage;
}

Assistant:

int AActor::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	if (target->player && target->player->mo == target && damage < 1000 &&
		(target->player->cheats & CF_GODMODE || target->player->cheats & CF_GODMODE2))
	{
		return -1;
	}
	else
	{
		if (target->player)
		{
			// Only do this for old style poison damage.
			if (PoisonDamage > 0 && PoisonDuration == INT_MIN)
			{
				P_PoisonPlayer (target->player, this, this->target, PoisonDamage);
				damage >>= 1;
			}
		}
	
		return damage;
	}
}